

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CopyClassExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CopyClassExpressionSyntax,slang::syntax::NameSyntax&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,NameSyntax *args,ExpressionSyntax *args_1)

{
  CopyClassExpressionSyntax *pCVar1;
  size_t in_RDX;
  ExpressionSyntax *in_RSI;
  BumpAllocator *in_RDI;
  CopyClassExpressionSyntax *unaff_retaddr;
  
  pCVar1 = (CopyClassExpressionSyntax *)allocate(in_RDI,(size_t)in_RSI,in_RDX);
  slang::syntax::CopyClassExpressionSyntax::CopyClassExpressionSyntax
            (unaff_retaddr,(NameSyntax *)in_RDI,in_RSI);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }